

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

bool checkParsed(QByteArrayView num,qsizetype used)

{
  storage_type *psVar1;
  long lVar2;
  
  psVar1 = num.m_data;
  lVar2 = num.m_size;
  if (used < 1) {
    return false;
  }
  if ((used < lVar2) && (psVar1[used] != '\0')) {
    for (; used < lVar2; used = used + 1) {
      if ((0x3f < (byte)psVar1[used]) || ((1L << (psVar1[used] & 0x3fU) & 0x100003e00U) == 0))
      goto LAB_001198fd;
    }
  }
  else {
LAB_001198fd:
    if ((used < lVar2) && (psVar1[used] != '\0')) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool checkParsed(QByteArrayView num, qsizetype used)
{
    if (used <= 0)
        return false;

    const qsizetype len = num.size();
    if (used < len && num[used] != '\0') {
        while (used < len && ascii_isspace(num[used]))
            ++used;
    }

    if (used < len && num[used] != '\0')
        // we stopped at a non-digit character after converting some digits
        return false;

    return true;
}